

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.hpp
# Opt level: O0

merkle_tree * __thiscall
libtorrent::aux::merkle_tree::operator=(merkle_tree *this,merkle_tree *param_1)

{
  mode_t mVar1;
  merkle_tree *param_1_local;
  merkle_tree *this_local;
  
  this->m_root = param_1->m_root;
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::operator=(&this->m_tree,&param_1->m_tree);
  bitfield::operator=(&this->m_block_verified,&param_1->m_block_verified);
  this->m_num_blocks = param_1->m_num_blocks;
  mVar1 = param_1->m_mode;
  this->m_blocks_per_piece_log = param_1->m_blocks_per_piece_log;
  this->m_mode = mVar1;
  return this;
}

Assistant:

struct TORRENT_EXTRA_EXPORT merkle_tree
{
	// TODO: remove this constructor. Don't support "uninitialized" trees. This
	// also requires not constructing these for pad-files and small files as
	// well. So, a sparse hash list in torrent_info
	merkle_tree() = default;
	merkle_tree(int num_blocks, int blocks_per_piece, char const* r);

	sha256_hash root() const;

	void load_tree(span<sha256_hash const> t, bitfield const& verified);
	void load_sparse_tree(span<sha256_hash const> t, bitfield const& mask
		, bitfield const& verified);
	void load_verified_bits(bitfield const& verified);

	std::size_t size() const;
	int end_index() const { return int(size()); }

	bool has_node(int idx) const;

	bool compare_node(int idx, sha256_hash const& h) const;

	sha256_hash operator[](int idx) const;

	std::vector<sha256_hash> build_vector() const;
	std::pair<std::vector<sha256_hash>, bitfield> build_sparse_vector() const;

	// get bits indicating if each leaf hash is verified
	bitfield verified_leafs() const;

	// returns true if the entire tree is known and verified
	bool is_complete() const;

	// returns true if all block hashes in the specified range have been verified
	bool blocks_verified(int block_idx, int num_blocks) const;

	bool load_piece_layer(span<char const> piece_layer);

	// the leafs in "tree" must be block hashes (i.e. leaf hashes in the this
	// tree). This function inserts those hashes as well as the nodes up the
	// tree. The destination start index is the index, in this tree, to the first leaf
	// where "tree" will be inserted.
	// inserts the nodes in "proofs" as a path up the tree. The proofs are
	// sibling hashes, as they are returned from add_hashes(). The hashes must
	// be valid.
	// if the hashes are not valid, or the uncle hashes fail validation, nullopt
	// is returned.
	std::optional<add_hashes_result_t> add_hashes(
		int dest_start_idx
		, piece_index_t::diff_type file_piece_offset
		, span<sha256_hash const> hashes
		, span<sha256_hash const> uncle_hashes);

	aux::vector<sha256_hash> get_piece_layer() const;

	enum class set_block_result
	{
		ok, unknown, hash_failed, block_hash_failed
	};

	std::tuple<set_block_result, int, int> set_block(int block_index
		, sha256_hash const& h);

	std::vector<sha256_hash> get_hashes(int base
		, int index, int count, int proof_layers) const;

private:

	// set to an empty tree
	void clear();

	sha256_hash get_impl(int idx, std::vector<sha256_hash>& scratch_space) const;

	int blocks_per_piece() const { return 1 << m_blocks_per_piece_log; }
	// the number tree levels per piece. This is 0 if the block layer is also
	// the piece layer.
	int piece_levels() const { return m_blocks_per_piece_log; }

	int block_layer_start() const;
	int piece_layer_start() const;
	int num_pieces() const;
	int num_leafs() const;

	void optimize_storage();
	void optimize_storage_piece_layer();
	void allocate_full();

	// a pointer to the root hash for this file.
	char const* m_root = nullptr;

	// this is either the full tree, or some sparse representation of it,
	// depending on m_mode
	// TODO: make this a std::unique_ptr<sha256_hash[]>
	aux::vector<sha256_hash> m_tree;

	// when the full tree is allocated, this has one bit for each block hash. a
	// 1 means we have verified the block hash to be correct, otherwise the block
	// hash may represent what's on disk, but we haven't been able to verify it
	// yet
	bitfield m_block_verified;

	// number of blocks in the file this tree represents. The number of leafs in
	// the tree is rounded up to an even power of 2.
	int m_num_blocks = 0;

	// the number of blocks per piece, specified as how many steps to shift
	// right 1 to get the number of blocks in one piece. This is a compact
	// representation that's valid because pieces are always powers of 2.
	// this is necessary to know which layer in the tree the piece layer is.
	std::uint8_t m_blocks_per_piece_log = 0;

	enum class mode_t : std::uint8_t
	{
		// a default constructed tree is truly empty. It does not even have a
		// root hash
		uninitialized_tree,

		// we don't have any hashes in this tree. m_tree should be empty
		// an empty tree still always have the root hash (available as root())
		empty_tree,

		// in this mode, m_tree represents the full tree, including padding.
		full_tree,

		// in this mode, m_tree represents the piece layer only, no padding
		// and all piece layer hashes are stored and valid
		piece_layer,

		// in this mode, m_tree represents the block (leaf) layer only, no padding
		// and all block layer hashes are stored and valid
		block_layer
	};
	mode_t m_mode = mode_t::uninitialized_tree;

#if TORRENT_USE_INVARIANT_CHECKS
	void check_invariant() const;
	friend struct libtorrent::invariant_access;
#endif
}